

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckDocType(TidyDocImpl *doc)

{
  Bool BVar1;
  ctmbstr __haystack;
  char *pcVar2;
  ctmbstr word;
  Node *DTnode;
  TidyDocImpl *doc_local;
  
  BVar1 = Level2_Enabled(doc);
  if (BVar1 != no) {
    word = (ctmbstr)prvTidyFindDocType(doc);
    if (((Node *)word != (Node *)0x0) && (((Node *)word)->end != 0)) {
      __haystack = textFromOneNode(doc,(Node *)word);
      BVar1 = prvTidyIsHTML5Mode(doc);
      if (BVar1 == no) {
        pcVar2 = strstr(__haystack,"HTML PUBLIC");
        if ((pcVar2 == (char *)0x0) &&
           (pcVar2 = strstr(__haystack,"html PUBLIC"), pcVar2 == (char *)0x0)) {
          word = (ctmbstr)0x0;
        }
      }
      else {
        pcVar2 = strstr(__haystack,"HTML");
        if ((pcVar2 == (char *)0x0) && (pcVar2 = strstr(__haystack,"html"), pcVar2 == (char *)0x0))
        {
          word = (ctmbstr)0x0;
        }
      }
    }
    if (word == (ctmbstr)0x0) {
      prvTidyReportAccessError(doc,&doc->root,0x2b5);
    }
  }
  return;
}

Assistant:

static void CheckDocType( TidyDocImpl* doc )
{
    if (Level2_Enabled( doc ))
    {
        Node* DTnode = TY_(FindDocType)(doc);

        /* If the doctype has been added by tidy, DTnode->end will be 0. */
        if (DTnode && DTnode->end != 0)
        {
            ctmbstr word = textFromOneNode( doc, DTnode);
            if (TY_(IsHTML5Mode)(doc))
            {
                if ((strstr(word, "HTML") == NULL) &&
                    (strstr(word, "html") == NULL))
                    DTnode = NULL;
            }
            else {
                if ((strstr(word, "HTML PUBLIC") == NULL) &&
                    (strstr(word, "html PUBLIC") == NULL))
                    DTnode = NULL;
            }
        }
        if (!DTnode)
           TY_(ReportAccessError)( doc, &doc->root, DOCTYPE_MISSING);
    }
}